

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,string *attribute)

{
  ulong uVar1;
  ostream *poVar2;
  string *in_RSI;
  XmlWriter *in_RDI;
  string *in_stack_00000068;
  XmlWriter *in_stack_00000070;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      poVar2 = stream(in_RDI);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::operator<<(poVar2,in_RSI);
      std::operator<<(poVar2,"=\"");
      writeEncodedText(in_stack_00000070,in_stack_00000068);
      poVar2 = stream(in_RDI);
      std::operator<<(poVar2,"\"");
    }
  }
  return in_RDI;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, std::string const& attribute ) {
            if( !name.empty() && !attribute.empty() ) {
                stream() << " " << name << "=\"";
                writeEncodedText( attribute );
                stream() << "\"";
            }
            return *this;
        }